

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

bool __thiscall
BayesianGameWithClusterInfo::TestExactEquivalence
          (BayesianGameWithClusterInfo *this,Index agI,Index t1,Index t2)

{
  BayesianGameIdenticalPayoff *pBVar1;
  pointer ppJVar2;
  JointBeliefInterface *pJVar3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  BayesianGameWithClusterInfo *pBVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  Index IVar12;
  Index IVar13;
  int iVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar15;
  ulong uVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrElems;
  JointBeliefInterface *extraout_XMM0_Qa;
  double p2;
  JointBeliefInterface *extraout_XMM0_Qa_00;
  JointBeliefInterface *extraout_XMM0_Qa_01;
  JointBeliefInterface *pJVar17;
  undefined1 auVar18 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2;
  BeliefIteratorGeneric bit2;
  BeliefIteratorGeneric bit1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  Index local_ac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  undefined **local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  JointBeliefInterface *local_78;
  Index local_6c;
  undefined **local_68;
  long *local_60;
  undefined8 local_58;
  long *local_50;
  JointBeliefInterface *local_48;
  BayesianGameWithClusterInfo *local_40;
  JointBeliefInterface *local_38;
  
  uVar4 = (ulong)agI;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar1 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  local_6c = t2;
  iVar11 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
             super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
             _vptr_Interface_ProblemToPolicyDiscrete[3])(pBVar1);
  local_58 = (undefined **)((ulong)local_58._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c8,CONCAT44(extraout_var,iVar11),(value_type_conflict1 *)&local_58,
             (allocator_type *)&local_68);
  puVar6 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar5 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  nrElems = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
  pJVar17 = (JointBeliefInterface *)0x0;
  local_78 = (JointBeliefInterface *)0x0;
  local_88 = (undefined **)0x0;
  bVar8 = false;
  local_ac = t1;
  local_80 = nrElems;
  while (bVar8 == false) {
    if ((ulong)((long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar4) goto LAB_0037e9b0;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] == t1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c8,&local_a8);
      if ((ulong)((long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = local_6c;
      IVar12 = IndexTools::IndividualToJointIndicesStepSize
                         (&local_a8,
                          (this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff.
                          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                          _m_stepSizeTypes);
      IVar13 = IndexTools::IndividualToJointIndicesStepSize
                         (&local_c8,
                          (this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff.
                          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                          _m_stepSizeTypes);
      (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(pBVar1,(ulong)IVar12);
      local_48 = pJVar17;
      (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(pBVar1,(ulong)IVar13);
      if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        local_38 = pJVar17;
        operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        pJVar17 = local_38;
      }
      local_88 = (undefined **)((double)local_88 + (double)local_48);
      pJVar17 = (JointBeliefInterface *)((double)local_78 + (double)pJVar17);
      nrElems = local_80;
      t1 = local_ac;
      local_78 = pJVar17;
    }
    bVar8 = IndexTools::Increment(&local_a8,nrElems);
  }
  iVar11 = (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
             super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
             _vptr_Interface_ProblemToPolicyDiscrete[3])(pBVar1);
  local_58 = (undefined **)((ulong)local_58 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c8,CONCAT44(extraout_var_00,iVar11),(value_type_conflict1 *)&local_58,
             (allocator_type *)&local_68);
  puVar6 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar5 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  auVar18 = ZEXT864(0) << 0x40;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  local_40 = this;
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bVar8 = true;
  bVar9 = false;
  while( true ) {
    pJVar17 = auVar18._0_8_;
    if ((bVar9 != false) || (!bVar8)) {
      if (bVar8) {
        iVar11 = (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                   super_Interface_ProblemToPolicyDiscretePure.
                   super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete
                   [3])(pBVar1);
        local_58 = (undefined **)((ulong)local_58 & 0xffffffff00000000);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_c8,CONCAT44(extraout_var_01,iVar11),(value_type_conflict1 *)&local_58,
                   (allocator_type *)&local_68);
        puVar6 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar5 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pJVar17 = (JointBeliefInterface *)0x0;
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar5 != (pointer)0x0) {
          operator_delete(puVar5,(long)puVar6 - (long)puVar5);
        }
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar8 = true;
        local_88 = &PTR__BeliefIteratorGeneric_0059cb30;
        bVar9 = false;
        while ((bVar9 == false && (bVar8))) {
          if ((ulong)((long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar4) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar4);
          }
          if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4] == t1) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c8,&local_a8);
            pBVar7 = local_40;
            if ((ulong)((long)local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar4) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar4);
            }
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] = local_6c;
            IVar12 = IndexTools::IndividualToJointIndicesStepSize
                               (&local_a8,
                                (local_40->super_BayesianGameForDecPOMDPStage).
                                super_BayesianGameIdenticalPayoff.
                                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                                _m_stepSizeTypes);
            IVar13 = IndexTools::IndividualToJointIndicesStepSize
                               (&local_c8,
                                (pBVar7->super_BayesianGameForDecPOMDPStage).
                                super_BayesianGameIdenticalPayoff.
                                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                                _m_stepSizeTypes);
            ppJVar2 = (pBVar7->super_BayesianGameForDecPOMDPStage)._m_JBs.
                      super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = (long)(pBVar7->super_BayesianGameForDecPOMDPStage)._m_JBs.
                           super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar2 >> 3;
            if (uVar16 <= IVar12) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            uVar15 = (ulong)IVar13;
            if (uVar16 <= uVar15) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar15);
            }
            pJVar3 = ppJVar2[IVar12];
            nrElems = local_80;
            t1 = local_ac;
            if ((pJVar3 != (JointBeliefInterface *)0x0) &&
               (ppJVar2[uVar15] != (JointBeliefInterface *)0x0)) {
              local_78 = ppJVar2[uVar15];
              (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[0xd])(pBVar1,(ulong)IVar12);
              t1 = local_ac;
              bVar9 = Globals::EqualProbability((double)pJVar17,0.0);
              nrElems = local_80;
              if (!bVar9) {
                (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                  super_Interface_ProblemToPolicyDiscretePure.
                  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete
                  [0xd])(pBVar1,(ulong)IVar13);
                bVar9 = Globals::EqualProbability((double)pJVar17,0.0);
                nrElems = local_80;
                if (!bVar9) {
                  (**(code **)(*(long *)((long)&pJVar3->field_0x0 + *(long *)((long)*pJVar3 + -0xb8)
                                        ) + 0x98))
                            (&local_58,(long)&pJVar3->field_0x0 + *(long *)((long)*pJVar3 + -0xb8));
                  (**(code **)(*(long *)((long)&local_78->field_0x0 +
                                        *(long *)((long)*local_78 + -0xb8)) + 0x98))
                            (&local_68,
                             (long)&local_78->field_0x0 + *(long *)((long)*local_78 + -0xb8));
                  nrElems = local_80;
                  do {
                    iVar11 = (**(code **)(*local_50 + 0x18))();
                    iVar14 = (**(code **)(*local_60 + 0x18))();
                    if (iVar11 == iVar14) {
                      local_78 = (JointBeliefInterface *)(**(code **)(*local_50 + 0x10))();
                      p2 = (double)(**(code **)(*local_60 + 0x10))();
                      pJVar17 = local_78;
                      bVar9 = Globals::EqualProbability((double)local_78,p2);
                      if (!bVar9) {
                        bVar8 = false;
                      }
                    }
                    else {
                      bVar8 = false;
                      pJVar17 = extraout_XMM0_Qa;
                    }
                  } while (((bVar8 != false) &&
                           (cVar10 = (**(code **)(*local_50 + 0x20))(),
                           pJVar17 = extraout_XMM0_Qa_00, cVar10 != '\0')) &&
                          (cVar10 = (**(code **)(*local_60 + 0x20))(), pJVar17 = extraout_XMM0_Qa_01
                          , cVar10 != '\0'));
                  local_68 = local_88;
                  if (local_60 != (long *)0x0) {
                    pJVar17 = (JointBeliefInterface *)(**(code **)(*local_60 + 8))();
                  }
                  local_58 = local_88;
                  if (local_50 != (long *)0x0) {
                    pJVar17 = (JointBeliefInterface *)(**(code **)(*local_50 + 8))();
                  }
                }
              }
            }
            if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          bVar9 = IndexTools::Increment(&local_a8,nrElems);
        }
      }
      else {
        bVar8 = false;
      }
      if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return bVar8;
    }
    if ((ulong)((long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar4) break;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] == t1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c8,&local_a8);
      pBVar7 = local_40;
      if ((ulong)((long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = local_6c;
      IVar12 = IndexTools::IndividualToJointIndicesStepSize
                         (&local_a8,
                          (local_40->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff.
                          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                          _m_stepSizeTypes);
      IVar13 = IndexTools::IndividualToJointIndicesStepSize
                         (&local_c8,
                          (pBVar7->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff.
                          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                          _m_stepSizeTypes);
      (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(pBVar1,(ulong)IVar12);
      local_48 = pJVar17;
      pJVar17 = local_48;
      (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(pBVar1,(ulong)IVar13);
      nrElems = local_80;
      auVar18 = ZEXT864((ulong)((double)local_48 / (double)local_88));
      bVar9 = Globals::EqualProbability
                        ((double)local_48 / (double)local_88,(double)pJVar17 / (double)local_78);
      t1 = local_ac;
      if (!bVar9) {
        bVar8 = false;
      }
      if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    bVar9 = IndexTools::Increment(&local_a8,nrElems);
  }
LAB_0037e9b0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

bool BayesianGameWithClusterInfo::TestExactEquivalence(Index agI, Index t1, Index t2) const
{
    //looping over all joint type profiles of the other agents
    //( over all type_{-i} ) is inconvenient.
    //Rather we loop over all joint types in this function
    
    //we start with the individual type vector corr. to joint type 0
    //(i.e., the vector with type index 0 for each agent).
    vector<Index> typeIndices;

    //first we compute the marginals P(t1) and P(t2)
    double p1, p2;
    p1 = p2 = 0.0;    
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    bool finished = false;
    bool equalProb=true;

    while( !finished )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            p1 += GetProbability(jtI1);
            p2 += GetProbability(jtI2);
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }



    //now we compare P(type{-i} | t1) =? P(type{-i} | t2)
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    finished = false;
    while( !finished && equalProb )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            //cout << "Comparing jtI1="<<jtI1<<"="
                //<<SoftPrintVector(typeIndices);
            //cout << "and jtI2="<<jtI2<<"="
                //<<SoftPrintVector(typeIndices2) << endl;
            double pjt1 =  GetProbability(jtI1);
            double pjt2 =  GetProbability(jtI2);
            double conditional_pjt1 = pjt1 / p1;
            double conditional_pjt2 = pjt2 / p2;
            //cout << "p1="<<p1
                //<<"\t,pjt1="<<pjt1
                //<<"\t,cpjt1="<<conditional_pjt1
                //<<"\np2="<<p2
                //<<"\t,pjt2="<<pjt2
                //<<"\t,cpjt2="<<conditional_pjt2
                //<<endl;
            if(! Globals::EqualProbability(conditional_pjt1,conditional_pjt2 ) )
            {
                equalProb=false;
            }
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }

#if !BGCLUSTER_OUTPUT_TESTEQUIVALENCE
    // if we want to check why two types are not equivalent, we also
    // need the second test, otherwise we can stop here
    if(!equalProb)
        return(false);
#endif

    //now we compare P(s, type{-i} | t1) =? P(s, type{-i} | t2)
    //or, actually we check that P(s |  type{-i}, t1) =? P(s | type{-i} , t2) 
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    finished = false;
    bool equalJB=true;
    while( !finished && equalJB )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( typeIndices2);
            JointBeliefInterface* jb1 = _m_JBs.at(jtI1);
            JointBeliefInterface* jb2 = _m_JBs.at(jtI2);
            // only do this test if the joint beliefs actually exist
            // (they may not in case the joint type has prob 0)
            if(jb1!=0 && jb2!=0 &&
               // If they exist, we still need to check whether can
               // actually occur!
               // In the old code (used for AAMAS09), this check was
               // missing, which is why the recycling problem
               // clustered to 9 JT there, instead of 4 now.
               !Globals::EqualProbability(GetProbability(jtI1),0.0) &&
               !Globals::EqualProbability(GetProbability(jtI2),0.0))
            {
                BeliefIteratorGeneric bit1 = jb1->GetIterator();
                BeliefIteratorGeneric bit2 = jb2->GetIterator();
                do
                {
                    // as the belief can be sparse, we also need to
                    // make sure the iterators point to the same state
                    // index, otherwise beliefs like [0 0 1 0] and [0
                    // 1 0 0] are considered equal
                    if(bit1.GetStateIndex() !=
                       bit2.GetStateIndex())
                        equalJB = false;
                    else
                    {
                        double p1 = bit1.GetProbability();
                        double p2 = bit2.GetProbability();
                        if(! Globals::EqualProbability(p1,p2) )
                            equalJB=false;
                    }
                }
                while(equalJB && bit1.Next() && bit2.Next());
            }
        }        
        finished = IndexTools::Increment(typeIndices, _m_nrTypes);
    }

#if BGCLUSTER_OUTPUT_TESTEQUIVALENCE
    if(!equalProb && !equalJB)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent both" << endl;
    else if(!equalProb)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent prob" << endl;
    else if(!equalJB)
        cout << "TESTEQUIVALENCE " << GetStage() << " notEquivalent belief" << endl;
    else
        cout << "TESTEQUIVALENCE " << GetStage() << " equivalent" << endl;
#endif

    if(equalProb && equalJB)
        return(true);
    else
        return(false);
}